

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O2

Statement *
slang::ast::WaitOrderStatement::fromSyntax
          (Compilation *compilation,WaitOrderStatementSyntax *syntax,ASTContext *context,
          StatementContext *stmtCtx)

{
  not_null<slang::syntax::ActionBlockSyntax_*> *this;
  size_type sVar1;
  bool bVar2;
  int iVar3;
  SyntaxNode *pSVar4;
  SourceLocation this_00;
  Type *this_01;
  ActionBlockSyntax *pAVar5;
  undefined4 extraout_var_00;
  StatementSyntax *pSVar6;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  WaitOrderStatement *stmt;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *src;
  ulong extraout_RDX_01;
  SourceRange SVar7;
  const_iterator __begin2;
  Statement *ifFalse;
  Statement *ifTrue;
  SmallVector<const_slang::ast::Expression_*,_5UL> events;
  span<const_slang::ast::Expression_*,_18446744073709551615UL> local_a8;
  StatementContext *local_98;
  Statement *local_90;
  Statement *local_88;
  SourceRange local_80;
  SmallVectorBase<const_slang::ast::Expression_*> local_70 [2];
  undefined4 extraout_var;
  
  local_70[0].data_ = (pointer)local_70[0].firstElement;
  local_70[0].len = 0;
  local_a8.size_ = 0;
  local_70[0].cap = 5;
  sVar1 = (syntax->names).elements.size_;
  local_a8.data_ = (pointer)&syntax->names;
  local_98 = stmtCtx;
  while( true ) {
    if (((SeparatedSyntaxList<slang::syntax::NameSyntax> *)local_a8.data_ == &syntax->names) &&
       (local_a8.size_ == sVar1 + 1 >> 1)) {
      local_88 = (Statement *)0x0;
      local_90 = (Statement *)0x0;
      this = &syntax->action;
      pAVar5 = not_null<slang::syntax::ActionBlockSyntax_*>::get(this);
      if (pAVar5->statement != (StatementSyntax *)0x0) {
        pAVar5 = not_null<slang::syntax::ActionBlockSyntax_*>::get(this);
        iVar3 = Statement::bind((int)pAVar5->statement,(sockaddr *)context,(socklen_t)local_98);
        local_88 = (Statement *)CONCAT44(extraout_var_00,iVar3);
      }
      pAVar5 = not_null<slang::syntax::ActionBlockSyntax_*>::get(this);
      src = extraout_RDX;
      if (pAVar5->elseClause != (ElseClauseSyntax *)0x0) {
        pAVar5 = not_null<slang::syntax::ActionBlockSyntax_*>::get(this);
        pSVar4 = not_null<slang::syntax::SyntaxNode_*>::get(&pAVar5->elseClause->clause);
        pSVar6 = slang::syntax::SyntaxNode::as<slang::syntax::StatementSyntax>(pSVar4);
        iVar3 = Statement::bind((int)pSVar6,(sockaddr *)context,(socklen_t)local_98);
        local_90 = (Statement *)CONCAT44(extraout_var_01,iVar3);
        src = extraout_RDX_00;
      }
      iVar3 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                        (local_70,(EVP_PKEY_CTX *)compilation,src);
      local_a8.data_ = (pointer)CONCAT44(extraout_var_02,iVar3);
      local_a8.size_ = extraout_RDX_01;
      local_80 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
      stmt = BumpAllocator::
             emplace<slang::ast::WaitOrderStatement,nonstd::span_lite::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::ast::Statement_const*&,slang::ast::Statement_const*&,slang::SourceRange>
                       (&compilation->super_BumpAllocator,&local_a8,&local_88,&local_90,&local_80);
      if ((((context->flags).m_bits & 0x6000) != 0) ||
         (bVar2 = ASTContext::inAlwaysCombLatch(context), bVar2)) {
        SVar7 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
        ASTContext::addDiag(context,(DiagCode)0x460008,SVar7);
        stmt = (WaitOrderStatement *)Statement::badStmt(compilation,&stmt->super_Statement);
      }
      goto LAB_00233d93;
    }
    pSVar4 = (SyntaxNode *)
             slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::
             iterator_base<const_slang::syntax::NameSyntax_*>::operator*
                       ((iterator_base<const_slang::syntax::NameSyntax_*> *)&local_a8);
    this_00._0_4_ = Expression::bind((int)pSVar4,(sockaddr *)context,0);
    this_00._4_4_ = extraout_var;
    bVar2 = Expression::bad((Expression *)this_00);
    if (bVar2) goto LAB_00233d84;
    this_01 = not_null<const_slang::ast::Type_*>::get
                        ((not_null<const_slang::ast::Type_*> *)((long)this_00 + 8));
    bVar2 = Type::isEvent(this_01);
    if (!bVar2) break;
    local_80.startLoc = this_00;
    SmallVectorBase<slang::ast::Expression_const*>::emplace_back<slang::ast::Expression_const*>
              ((SmallVectorBase<slang::ast::Expression_const*> *)local_70,(Expression **)&local_80);
    local_a8.size_ = local_a8.size_ + 1;
  }
  SVar7 = slang::syntax::SyntaxNode::sourceRange(pSVar4);
  ASTContext::addDiag(context,(DiagCode)0x2c0008,SVar7);
LAB_00233d84:
  stmt = (WaitOrderStatement *)Statement::badStmt(compilation,(Statement *)0x0);
LAB_00233d93:
  SmallVectorBase<const_slang::ast::Expression_*>::~SmallVectorBase(local_70);
  return &stmt->super_Statement;
}

Assistant:

Statement& WaitOrderStatement::fromSyntax(Compilation& compilation,
                                          const WaitOrderStatementSyntax& syntax,
                                          const ASTContext& context, StatementContext& stmtCtx) {
    SmallVector<const Expression*> events;
    for (auto name : syntax.names) {
        auto& ev = Expression::bind(*name, context);
        if (ev.bad())
            return badStmt(compilation, nullptr);

        if (!ev.type->isEvent()) {
            context.addDiag(diag::NotAnEvent, name->sourceRange());
            return badStmt(compilation, nullptr);
        }

        events.push_back(&ev);
    }

    const Statement* ifTrue = nullptr;
    const Statement* ifFalse = nullptr;
    if (syntax.action->statement)
        ifTrue = &Statement::bind(*syntax.action->statement, context, stmtCtx);

    if (syntax.action->elseClause) {
        ifFalse = &Statement::bind(syntax.action->elseClause->clause->as<StatementSyntax>(),
                                   context, stmtCtx);
    }

    auto result = compilation.emplace<WaitOrderStatement>(events.copy(compilation), ifTrue, ifFalse,
                                                          syntax.sourceRange());
    if (context.flags.has(ASTFlags::Function) || context.flags.has(ASTFlags::Final) ||
        context.inAlwaysCombLatch()) {
        context.addDiag(diag::TimingInFuncNotAllowed, syntax.sourceRange());
        return badStmt(compilation, result);
    }

    return *result;
}